

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void google::protobuf::internal::SwapFieldHelper::SwapInlinedStrings<true>
               (Reflection *r,Message *lhs,Message *rhs,FieldDescriptor *field)

{
  ReflectionSchema *this;
  Message *pMVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  LogMessage *pLVar4;
  ulong uVar5;
  LogFinisher local_121;
  uint32_t local_120;
  uint32_t local_11c;
  Message *local_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  this = &r->schema_;
  local_118 = rhs;
  local_11c = ReflectionSchema::GetFieldOffset(this,field);
  local_120 = ReflectionSchema::GetFieldOffset(this,field);
  ReflectionSchema::InlinedStringIndex(this,field);
  if ((r->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_d8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar4 = LogMessage::operator<<(&local_d8,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    LogMessage::~LogMessage(&local_d8);
  }
  ReflectionSchema::InlinedStringDonatedOffset(this);
  if ((r->schema_).has_bits_offset_ == -1) {
    LogMessage::LogMessage
              (&local_a0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x99d);
    pLVar4 = LogMessage::operator<<(&local_a0,"CHECK failed: schema_.HasHasbits(): ");
    LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    LogMessage::~LogMessage(&local_a0);
  }
  ReflectionSchema::InlinedStringDonatedOffset(this);
  if ((r->schema_).inlined_string_donated_offset_ == -1) {
    LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x997);
    pLVar4 = LogMessage::operator<<(&local_68,"CHECK failed: schema_.HasInlinedString(): ");
    LogFinisher::operator=((LogFinisher *)&local_110,pLVar4);
    LogMessage::~LogMessage(&local_68);
  }
  uVar2 = ReflectionSchema::InlinedStringDonatedOffset(this);
  uVar3 = ReflectionSchema::InlinedStringIndex(this,field);
  anon_unknown_0::IsIndexInHasBitSet
            ((uint32_t *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),uVar3);
  if ((r->schema_).inlined_string_donated_offset_ == -1) {
    LogMessage::LogMessage
              (&local_110,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/generated_message_reflection.cc"
               ,0x997);
    pLVar4 = LogMessage::operator<<(&local_110,"CHECK failed: schema_.HasInlinedString(): ");
    LogFinisher::operator=(&local_121,pLVar4);
    LogMessage::~LogMessage(&local_110);
  }
  pMVar1 = local_118;
  uVar5 = (ulong)local_11c;
  uVar2 = ReflectionSchema::InlinedStringDonatedOffset(this);
  uVar3 = ReflectionSchema::InlinedStringIndex(this,field);
  anon_unknown_0::IsIndexInHasBitSet
            ((uint32_t *)((long)&(pMVar1->super_MessageLite)._vptr_MessageLite + (ulong)uVar2),uVar3
            );
  std::__cxx11::string::swap((string *)((long)&(lhs->super_MessageLite)._vptr_MessageLite + uVar5));
  return;
}

Assistant:

void SwapFieldHelper::SwapInlinedStrings(const Reflection* r, Message* lhs,
                                         Message* rhs,
                                         const FieldDescriptor* field) {
  // Inlined string field.
  Arena* lhs_arena = lhs->GetArenaForAllocation();
  Arena* rhs_arena = rhs->GetArenaForAllocation();
  auto* lhs_string = r->MutableRaw<InlinedStringField>(lhs, field);
  auto* rhs_string = r->MutableRaw<InlinedStringField>(rhs, field);
  const uint32 index = r->schema_.InlinedStringIndex(field);
  uint32* lhs_state = &r->MutableInlinedStringDonatedArray(lhs)[index / 32];
  uint32* rhs_state = &r->MutableInlinedStringDonatedArray(rhs)[index / 32];
  const uint32 mask = ~(static_cast<uint32>(1) << (index % 32));
  if (unsafe_shallow_swap || lhs_arena == rhs_arena) {
    lhs_string->Swap(rhs_string, /*default_value=*/nullptr, lhs_arena,
                     r->IsInlinedStringDonated(*lhs, field),
                     r->IsInlinedStringDonated(*rhs, field),
                     /*donating_states=*/lhs_state, rhs_state, mask);
  } else {
    const std::string temp = lhs_string->Get();
    lhs_string->Set(nullptr, rhs_string->Get(), lhs_arena,
                    r->IsInlinedStringDonated(*lhs, field), lhs_state, mask);
    rhs_string->Set(nullptr, temp, rhs_arena,
                    r->IsInlinedStringDonated(*rhs, field), rhs_state, mask);
  }
}